

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O2

void __thiscall BackwardPass::ProcessTransfers(BackwardPass *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  StackSym *pSVar3;
  ObjectSymInfo *pOVar4;
  undefined4 *puVar5;
  PropertySym *pPVar6;
  undefined1 auStack_78 [8];
  BVSparse<Memory::JitArenaAllocator> transferFields;
  BVSparse<Memory::JitArenaAllocator> equivFields;
  
  if (((this->tag == DeadStorePhase) &&
      (this->currentBlock->upwardExposedFields != (BVSparse<Memory::JitArenaAllocator> *)0x0)) &&
     (instr->m_opcode == Ld_A)) {
    pSVar3 = IR::Opnd::GetStackSym(instr->m_dst);
    if (pSVar3 != (StackSym *)0x0) {
      pSVar3 = IR::Opnd::GetStackSym(instr->m_dst);
      if ((pSVar3->field_0x1a & 1) == 0) {
        pSVar3 = IR::Opnd::GetStackSym(instr->m_dst);
        bVar2 = StackSym::HasObjectInfo(pSVar3);
        if ((bVar2) && (instr->m_src1 != (Opnd *)0x0)) {
          pSVar3 = IR::Opnd::GetStackSym(instr->m_src1);
          if (pSVar3 != (StackSym *)0x0) {
            pSVar3 = IR::Opnd::GetStackSym(instr->m_src1);
            if ((pSVar3->field_0x1a & 1) == 0) {
              pSVar3 = IR::Opnd::GetStackSym(instr->m_src1);
              bVar2 = StackSym::HasObjectInfo(pSVar3);
              if (bVar2) {
                pSVar3 = IR::Opnd::GetStackSym(instr->m_dst);
                pOVar4 = StackSym::GetObjectInfo(pSVar3);
                pPVar6 = pOVar4->m_propertySymList;
                transferFields.lastFoundIndex = (Type_conflict)this->tempAlloc;
                transferFields.alloc = (Type)auStack_78;
                auStack_78 = (undefined1  [8])0x0;
                transferFields.head = (Type_conflict)0x0;
                puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
                for (; pPVar6 != (PropertySym *)0x0; pPVar6 = pPVar6->m_nextInStackSymList) {
                  if (pPVar6->m_stackSym != pSVar3) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *puVar5 = 1;
                    bVar2 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                       ,0x1f98,"(dstPropertySym->m_stackSym == dstStackSym)",
                                       "dstPropertySym->m_stackSym == dstStackSym");
                    if (!bVar2) goto LAB_003cc2f1;
                    *puVar5 = 0;
                  }
                  BVSparse<Memory::JitArenaAllocator>::Set
                            ((BVSparse<Memory::JitArenaAllocator> *)auStack_78,
                             (pPVar6->super_Sym).m_id);
                }
                pSVar3 = IR::Opnd::GetStackSym(instr->m_src1);
                pOVar4 = StackSym::GetObjectInfo(pSVar3);
                pPVar6 = pOVar4->m_propertySymList;
                transferFields.lastUsedNodePrevNextField = (Type)0x0;
                for (; pPVar6 != (PropertySym *)0x0; pPVar6 = pPVar6->m_nextInStackSymList) {
                  bVar2 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                                    ((BVSparse<Memory::JitArenaAllocator> *)auStack_78);
                  if (bVar2) break;
                  if (pPVar6->m_stackSym != pSVar3) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *puVar5 = 1;
                    bVar2 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                       ,0x1fa3,"(srcPropertySym->m_stackSym == srcStackSym)",
                                       "srcPropertySym->m_stackSym == srcStackSym");
                    if (!bVar2) {
LAB_003cc2f1:
                      pcVar1 = (code *)invalidInstructionException();
                      (*pcVar1)();
                    }
                    *puVar5 = 0;
                  }
                  if (pPVar6->m_propertyEquivSet != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
                    BVSparse<Memory::JitArenaAllocator>::And
                              ((BVSparse<Memory::JitArenaAllocator> *)
                               &transferFields.lastUsedNodePrevNextField,
                               (BVSparse<Memory::JitArenaAllocator> *)auStack_78,
                               pPVar6->m_propertyEquivSet);
                    bVar2 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                                      ((BVSparse<Memory::JitArenaAllocator> *)
                                       &transferFields.lastUsedNodePrevNextField);
                    if (!bVar2) {
                      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
                                ((BVSparse<Memory::JitArenaAllocator> *)auStack_78,
                                 (BVSparse<Memory::JitArenaAllocator> *)
                                 &transferFields.lastUsedNodePrevNextField);
                      BVSparse<Memory::JitArenaAllocator>::Set
                                (this->currentBlock->upwardExposedFields,(pPVar6->super_Sym).m_id);
                    }
                  }
                }
                BVSparse<Memory::JitArenaAllocator>::~BVSparse
                          ((BVSparse<Memory::JitArenaAllocator> *)
                           &transferFields.lastUsedNodePrevNextField);
                BVSparse<Memory::JitArenaAllocator>::~BVSparse
                          ((BVSparse<Memory::JitArenaAllocator> *)auStack_78);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
BackwardPass::ProcessTransfers(IR::Instr * instr)
{
    if (this->tag == Js::DeadStorePhase &&
        this->currentBlock->upwardExposedFields &&
        instr->m_opcode == Js::OpCode::Ld_A &&
        instr->GetDst()->GetStackSym() &&
        !instr->GetDst()->GetStackSym()->IsTypeSpec() &&
        instr->GetDst()->GetStackSym()->HasObjectInfo() &&
        instr->GetSrc1() &&
        instr->GetSrc1()->GetStackSym() &&
        !instr->GetSrc1()->GetStackSym()->IsTypeSpec() &&
        instr->GetSrc1()->GetStackSym()->HasObjectInfo())
    {
        StackSym * dstStackSym = instr->GetDst()->GetStackSym();
        PropertySym * dstPropertySym = dstStackSym->GetObjectInfo()->m_propertySymList;
        BVSparse<JitArenaAllocator> transferFields(this->tempAlloc);
        while (dstPropertySym != nullptr)
        {
            Assert(dstPropertySym->m_stackSym == dstStackSym);
            transferFields.Set(dstPropertySym->m_id);
            dstPropertySym = dstPropertySym->m_nextInStackSymList;
        }

        StackSym * srcStackSym = instr->GetSrc1()->GetStackSym();
        PropertySym * srcPropertySym = srcStackSym->GetObjectInfo()->m_propertySymList;
        BVSparse<JitArenaAllocator> equivFields(this->tempAlloc);

        while (srcPropertySym != nullptr && !transferFields.IsEmpty())
        {
            Assert(srcPropertySym->m_stackSym == srcStackSym);
            if (srcPropertySym->m_propertyEquivSet)
            {
                equivFields.And(&transferFields, srcPropertySym->m_propertyEquivSet);
                if (!equivFields.IsEmpty())
                {
                    transferFields.Minus(&equivFields);
                    this->currentBlock->upwardExposedFields->Set(srcPropertySym->m_id);
                }
            }
            srcPropertySym = srcPropertySym->m_nextInStackSymList;
        }
    }
}